

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O1

void initialize_F(void)

{
  uint uVar1;
  shifts *psVar2;
  int iVar3;
  Yshort **relation;
  char *__ptr;
  Yshort *pYVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint *puVar11;
  long lVar12;
  
  F = (uint *)allocate(ngotos * tokensetsize * 4);
  relation = (Yshort **)allocate(ngotos << 3);
  __ptr = allocate(ngotos * 4 + 4);
  if (0 < ngotos) {
    lVar7 = 0;
    puVar11 = F;
    do {
      pYVar4 = accessing_symbol;
      iVar9 = to_state[lVar7];
      psVar2 = shift_table[iVar9];
      if (psVar2 != (shifts *)0x0) {
        uVar1 = psVar2->nshifts;
        uVar10 = 0;
        uVar6 = 0;
        if (0 < (int)uVar1) {
          uVar6 = 0;
          do {
            iVar3 = pYVar4[psVar2->shift[uVar6]];
            if (start_symbol <= iVar3) goto LAB_0010d0e7;
            puVar11[iVar3 >> 5] = puVar11[iVar3 >> 5] | 1 << ((byte)iVar3 & 0x1f);
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
          uVar6 = (ulong)uVar1;
        }
LAB_0010d0e7:
        if ((int)uVar6 < (int)uVar1) {
          pYVar4 = psVar2->shift + (uVar6 & 0xffffffff);
          uVar10 = 0;
          do {
            if (nullable[accessing_symbol[*pYVar4]] != '\0') {
              iVar3 = map_goto(iVar9,accessing_symbol[*pYVar4]);
              iVar8 = (int)uVar10;
              uVar10 = (ulong)(iVar8 + 1);
              *(int *)(__ptr + (long)iVar8 * 4) = iVar3;
            }
            pYVar4 = pYVar4 + 1;
            uVar5 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar5;
          } while ((int)uVar5 < (int)uVar1);
        }
        iVar9 = (int)uVar10;
        if (iVar9 != 0) {
          pYVar4 = (Yshort *)allocate(iVar9 * 4 + 4);
          relation[lVar7] = pYVar4;
          if (0 < iVar9) {
            uVar6 = 0;
            do {
              pYVar4[uVar6] = *(Yshort *)(__ptr + uVar6 * 4);
              uVar6 = uVar6 + 1;
            } while (uVar10 != uVar6);
          }
          pYVar4[iVar9] = -1;
        }
      }
      puVar11 = puVar11 + tokensetsize;
      lVar7 = lVar7 + 1;
    } while (lVar7 < ngotos);
  }
  *F = *F | 1;
  digraph(relation);
  lVar7 = (long)ngotos;
  if (0 < lVar7) {
    lVar12 = 0;
    do {
      if (relation[lVar12] != (Yshort *)0x0) {
        free(relation[lVar12]);
      }
      lVar12 = lVar12 + 1;
    } while (lVar7 != lVar12);
  }
  free(relation);
  free(__ptr);
  return;
}

Assistant:

void initialize_F()
{
  register int i;
  register int j;
  register int k;
  register shifts *sp;
  register Yshort *edge;
  register unsigned *rowp;
  register Yshort *rp;
  register Yshort **reads;
  register int nedges;
  register int stateno;
  register int symbol;
  register int nwords;

  nwords = ngotos * tokensetsize;
  F = NEW2(nwords, unsigned);

  reads = NEW2(ngotos, Yshort *);
  edge = NEW2(ngotos + 1, Yshort);
  nedges = 0;

  rowp = F;
  for (i = 0; i < ngotos; i++)
    {
      stateno = to_state[i];
      sp = shift_table[stateno];

      if (sp)
	{
	  k = sp->nshifts;

	  for (j = 0; j < k; j++)
	    {
	      symbol = accessing_symbol[sp->shift[j]];
	      if (ISVAR(symbol))
		break;
	      SETBIT(rowp, symbol);
	    }

	  for (; j < k; j++)
	    {
	      symbol = accessing_symbol[sp->shift[j]];
	      if (nullable[symbol])
		edge[nedges++] = map_goto(stateno, symbol);
	    }
	
	  if (nedges)
	    {
	      reads[i] = rp = NEW2(nedges + 1, Yshort);

	      for (j = 0; j < nedges; j++)
		rp[j] = edge[j];

	      rp[nedges] = -1;
	      nedges = 0;
	    }
	}

      rowp += tokensetsize;
    }

  SETBIT(F, 0);
  digraph(reads);

  for (i = 0; i < ngotos; i++)
    {
      if (reads[i])
	FREE(reads[i]);
    }

  FREE(reads);
  FREE(edge);
}